

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relative_entropy.c
# Opt level: O0

double * inform_local_relative_entropy(int *xs,int *ys,size_t n,int b,double *re,inform_error *err)

{
  _Bool _Var1;
  double dVar2;
  ulong local_70;
  size_t i;
  double q;
  double p;
  inform_dist *y;
  inform_dist *x;
  inform_error *piStack_40;
  _Bool allocate_re;
  inform_error *err_local;
  double *re_local;
  size_t sStack_28;
  int b_local;
  size_t n_local;
  int *ys_local;
  int *xs_local;
  
  piStack_40 = err;
  err_local = (inform_error *)re;
  re_local._4_4_ = b;
  sStack_28 = n;
  n_local = (size_t)ys;
  ys_local = xs;
  _Var1 = check_arguments(xs,ys,n,b,err);
  if (_Var1) {
    xs_local = (int *)0x0;
  }
  else {
    x._7_1_ = err_local == (inform_error *)0x0;
    if (((bool)x._7_1_) &&
       (err_local = (inform_error *)malloc(sStack_28 << 3), err_local == (inform_error *)0x0)) {
      if (piStack_40 != (inform_error *)0x0) {
        *piStack_40 = INFORM_ENOMEM;
      }
      xs_local = (int *)0x0;
    }
    else {
      y = (inform_dist *)0x0;
      p = 0.0;
      _Var1 = allocate(re_local._4_4_,&y,(inform_dist **)&p,piStack_40);
      if (_Var1) {
        if ((x._7_1_ & 1) != 0) {
          free(err_local);
        }
        xs_local = (int *)0x0;
      }
      else {
        accumulate(ys_local,(int *)n_local,sStack_28,y,(inform_dist *)p);
        for (local_70 = 0; local_70 < (ulong)(long)re_local._4_4_; local_70 = local_70 + 1) {
          dVar2 = log2((double)y->histogram[local_70] / (double)*(uint *)(*(long *)p + local_70 * 4)
                      );
          *(double *)(err_local + local_70 * 2) = dVar2;
        }
        free_all(&y,(inform_dist **)&p);
        xs_local = err_local;
      }
    }
  }
  return (double *)xs_local;
}

Assistant:

double *inform_local_relative_entropy(int const *xs, int const *ys, size_t n,
    int b, double *re, inform_error *err)
{
    if (check_arguments(xs, ys, n, b, err)) return NULL;

    bool allocate_re = (re == NULL);
    if (allocate_re)
    {
        re = malloc(n * sizeof(double));
        if (re == NULL)
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist *x = NULL, *y = NULL;
    if (allocate(b, &x, &y, err))
    {
        if (allocate_re) free(re);
        return NULL;
    }

    accumulate(xs, ys, n, x, y);

    double p, q;
    for (size_t i = 0; i < (size_t) b; ++i)
    {
        p = x->histogram[i];
        q = y->histogram[i];
        re[i] = log2(p / q);
    }

    free_all(&x, &y);

    return re;
}